

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::RemoveEntry(cmCursesMainForm *this,char *value)

{
  cmake *this_00;
  int iVar1;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar2;
  char *__s2;
  const_iterator __position;
  allocator local_49;
  string local_48;
  
  if (value != (char *)0x0) {
    pvVar2 = this->Entries;
    for (__position._M_current =
              (pvVar2->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (pvVar2->
        super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
        )._M_impl.super__Vector_impl_data._M_finish;
        __position._M_current = __position._M_current + 1) {
      __s2 = cmCursesCacheEntryComposite::GetValue(*__position._M_current);
      if ((__s2 != (char *)0x0) && (iVar1 = strcmp(value,__s2), iVar1 == 0)) {
        this_00 = this->CMakeInstance;
        std::__cxx11::string::string((string *)&local_48,value,&local_49);
        cmake::UnwatchUnusedCli(this_00,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
        erase(this->Entries,__position);
        return;
      }
      pvVar2 = this->Entries;
    }
  }
  return;
}

Assistant:

void cmCursesMainForm::RemoveEntry(const char* value)
{
  if (!value)
    {
    return;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* val = (*it)->GetValue();
    if (  val && !strcmp(value, val) )
      {
      this->CMakeInstance->UnwatchUnusedCli(value);
      this->Entries->erase(it);
      break;
      }
    }
}